

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O1

global_object_create_result *
mjs::make_json_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  gc_heap *h;
  void *pvVar1;
  long *plVar2;
  function_object *pfVar3;
  gc_heap_ptr<mjs::function_object> o;
  gc_heap_ptr<mjs::gc_function> p;
  gc_heap_ptr<mjs::object> json;
  gc_heap_ptr_untyped local_c8;
  gc_heap_ptr_untyped local_b8;
  gc_heap_ptr_untyped local_a8;
  undefined1 local_98 [16];
  gc_heap_ptr_untyped local_88;
  gc_heap_ptr_untyped local_78;
  undefined1 local_68 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_60;
  undefined1 local_40 [24];
  char *local_28;
  
  pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  if (1 < *(int *)((long)pvVar1 + 0x20)) {
    h = (global->super_gc_heap_ptr_untyped).heap_;
    local_98._0_8_ = (gc_heap *)0x4;
    local_98._8_8_ = "JSON";
    string::string((string *)local_68,h,(string_view *)local_98);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar2 + 0x58))(&local_a8,plVar2);
    gc_heap::allocate_and_construct<mjs::object,mjs::string,mjs::gc_heap_ptr<mjs::object>>
              ((gc_heap *)local_40,(size_t)h,(string *)0x20,(gc_heap_ptr<mjs::object> *)local_68);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
    local_88.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_88.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if ((slot *)local_88.heap_ != (slot *)0x0) {
      gc_heap::attach(local_88.heap_,&local_88);
    }
    local_40._16_8_ = (slot *)0x5;
    local_28 = "parse";
    string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                   (string_view *)(local_40 + 0x10));
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
    make_raw_function((mjs *)&local_c8,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_c8);
    local_a8.heap_ = (gc_heap *)0x0;
    local_a8.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001d95b8;
    *(gc_heap **)((long)pvVar1 + 0x10) = local_88.heap_;
    *(uint32_t *)((long)pvVar1 + 0x18) = local_88.pos_;
    if ((slot *)local_88.heap_ != (slot *)0x0) {
      gc_heap::attach(local_88.heap_,(gc_heap_ptr_untyped *)((long)pvVar1 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_a8,2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
    local_b8.heap_ = local_c8.heap_;
    local_b8.pos_ = local_c8.pos_;
    if (local_c8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_c8.heap_,&local_b8);
    }
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_b8.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_b8.pos_;
    if (local_b8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_b8.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_78,local_68,2);
    value::destroy((value *)local_68);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
    local_88.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_88.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if ((slot *)local_88.heap_ != (slot *)0x0) {
      gc_heap::attach(local_88.heap_,&local_88);
    }
    local_40._16_8_ = (slot *)0x9;
    local_28 = "stringify";
    string::string((string *)&local_78,(global->super_gc_heap_ptr_untyped).heap_,
                   (string_view *)(local_40 + 0x10));
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_40);
    make_raw_function((mjs *)&local_c8,global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_c8);
    local_a8.heap_ = (gc_heap *)0x0;
    local_a8.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_98,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_98);
    *(undefined ***)((long)pvVar1 + 8) = &PTR_destroy_001d95f8;
    *(gc_heap **)((long)pvVar1 + 0x10) = local_88.heap_;
    *(uint32_t *)((long)pvVar1 + 0x18) = local_88.pos_;
    if ((slot *)local_88.heap_ != (slot *)0x0) {
      gc_heap::attach(local_88.heap_,(gc_heap_ptr_untyped *)((long)pvVar1 + 0x10));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_98,
               (gc_heap_ptr<mjs::gc_string> *)&local_78,(gc_heap_ptr<mjs::gc_string> *)&local_a8,3);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a8);
    local_b8.heap_ = local_c8.heap_;
    local_b8.pos_ = local_c8.pos_;
    if (local_c8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_c8.heap_,&local_b8);
    }
    local_68._0_4_ = object;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_b8.heap_;
    local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_b8.pos_;
    if (local_b8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_b8.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_78,local_68,2);
    value::destroy((value *)local_68);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
    (__return_storage_ptr__->obj).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_40._0_8_;
    (__return_storage_ptr__->obj).super_gc_heap_ptr_untyped.pos_ = local_40._8_4_;
    if ((gc_heap *)local_40._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_40._0_8_,(gc_heap_ptr_untyped *)__return_storage_ptr__);
    }
    (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
    (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.pos_ = 0;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_40);
    return __return_storage_ptr__;
  }
  __assert_fail("global->language_version() >= version::es5",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                ,0x2e9,
                "global_object_create_result mjs::make_json_object(const gc_heap_ptr<global_object> &)"
               );
}

Assistant:

global_object_create_result make_json_object(const gc_heap_ptr<global_object>& global) {
    assert(global->language_version() >= version::es5);
    auto& h = global.heap();
    auto json = h.make<object>(string{h,"JSON"}, global->object_prototype());

    put_native_function(global, json, "parse", [global](const value&, const std::vector<value>& args) {
        auto g = global; // Keep local copy in case the function gets GC'ed
        return json_parse(g, args);
    }, 2);
    
    put_native_function(global, json, "stringify", [global](const value&, const std::vector<value>& args) {
        auto g = global; // Keep local copy in case the function gets GC'ed
        return json_stringify(g, args);
    }, 3);

    return { json, nullptr };
}